

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_xonly_pubkey_tweak_add_check
              (secp256k1_context *ctx,uchar *tweaked_pubkey32,int tweaked_pk_parity,
              secp256k1_xonly_pubkey *internal_pubkey,uchar *tweak32)

{
  int iVar1;
  long in_RCX;
  int in_EDX;
  void *in_RSI;
  long in_R8;
  uchar pk_expected32 [32];
  secp256k1_ge pk;
  secp256k1_ge *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  bool bVar2;
  uchar local_a8 [16];
  uchar *in_stack_ffffffffffffff68;
  secp256k1_ge *in_stack_ffffffffffffff70;
  secp256k1_fe local_88;
  secp256k1_fe sStack_60;
  int local_1c;
  void *local_18;
  
  if (in_RCX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               (char *)in_stack_ffffffffffffff48);
  }
  else if (in_RSI == (void *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               (char *)in_stack_ffffffffffffff48);
  }
  else if (in_R8 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               (char *)in_stack_ffffffffffffff48);
  }
  else {
    local_1c = in_EDX;
    local_18 = in_RSI;
    iVar1 = secp256k1_xonly_pubkey_load
                      ((secp256k1_context *)
                       CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff48,(secp256k1_xonly_pubkey *)0x107f44);
    if ((iVar1 != 0) &&
       (iVar1 = secp256k1_ec_pubkey_tweak_add_helper
                          (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68), iVar1 != 0)) {
      secp256k1_fe_impl_normalize_var(&local_88);
      secp256k1_fe_impl_normalize_var(&sStack_60);
      secp256k1_fe_impl_get_b32(local_a8,&local_88);
      iVar1 = secp256k1_memcmp_var(local_a8,local_18,0x20);
      bVar2 = false;
      if (iVar1 == 0) {
        iVar1 = secp256k1_fe_impl_is_odd(&sStack_60);
        bVar2 = iVar1 == local_1c;
      }
      return (uint)bVar2;
    }
  }
  return 0;
}

Assistant:

int secp256k1_xonly_pubkey_tweak_add_check(const secp256k1_context* ctx, const unsigned char *tweaked_pubkey32, int tweaked_pk_parity, const secp256k1_xonly_pubkey *internal_pubkey, const unsigned char *tweak32) {
    secp256k1_ge pk;
    unsigned char pk_expected32[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(internal_pubkey != NULL);
    ARG_CHECK(tweaked_pubkey32 != NULL);
    ARG_CHECK(tweak32 != NULL);

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, internal_pubkey)
        || !secp256k1_ec_pubkey_tweak_add_helper(&pk, tweak32)) {
        return 0;
    }
    secp256k1_fe_normalize_var(&pk.x);
    secp256k1_fe_normalize_var(&pk.y);
    secp256k1_fe_get_b32(pk_expected32, &pk.x);

    return secp256k1_memcmp_var(&pk_expected32, tweaked_pubkey32, 32) == 0
            && secp256k1_fe_is_odd(&pk.y) == tweaked_pk_parity;
}